

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O1

void __thiscall
Test_Template_TemplateString::Test_Template_TemplateString(Test_Template_TemplateString *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  if (g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void(*)(),std::allocator<void(*)()>>::_M_realloc_insert<void(*)()>
              ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,
               (iterator)
               g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_8);
  }
  else {
    *g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
     super__Vector_impl_data._M_finish = Run;
    g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
    super__Vector_impl_data._M_finish =
         g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  return;
}

Assistant:

TEST(Template, TemplateString) {
  // Make sure using TemplateString and StaticTemplateString for the
  // dictionary expands the same as using char*'s.
  Template* tpl = StringToTemplate("hi {{VAR}} lo", STRIP_WHITESPACE);
  TemplateDictionary dict("dict");
  dict.SetValue("VAR", TemplateString("short-lived", strlen("short")));
  AssertExpandIs(tpl, &dict, "hi short lo", true);
  dict.SetValue("VAR", kHello);
  AssertExpandIs(tpl, &dict, "hi Hello lo", true);
}